

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall Sonne::Config::Write(Config *this,string *path)

{
  json configObject;
  ofstream out;
  undefined1 local_218 [16];
  _Base_ptr local_208;
  filebuf local_200 [8];
  undefined8 auStack_1f8 [29];
  ios_base local_110 [264];
  
  _ConstructConfigJSON_abi_cxx11_((Config *)local_218);
  std::ofstream::ofstream(&local_208,(string *)path,_S_out);
  *(undefined8 *)((long)auStack_1f8 + (long)local_208[-1]._M_parent) = 4;
  nlohmann::operator<<
            ((ostream *)&local_208,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_218);
  std::ofstream::close();
  local_208 = _VTT;
  *(undefined8 *)((long)&local_208 + (long)_VTT[-1]._M_parent) = _typeinfo;
  std::filebuf::~filebuf(local_200);
  std::ios_base::~ios_base(local_110);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_218);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_218 + 8),local_218[0]);
  return;
}

Assistant:

void Config::Write(const std::string& path)
{
    nlohmann::json configObject = _ConstructConfigJSON();

    std::ofstream out(path);

    out << std::setw(4) << configObject;

    out.close();
}